

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,AssignmentNode *node)

{
  AssignmentOperator *__k;
  element_type *peVar1;
  Value *pVVar2;
  unique_ptr<Value,_std::default_delete<Value>_> value;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var3;
  mapped_type *pmVar4;
  Executor *pEVar5;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar6;
  double newValue;
  NumberValueAnalyser valueAnalyser;
  RuntimeVariableAnalyser analyser;
  string name;
  Executor executor;
  _Head_base<0UL,_Value_*,_false> local_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_330 [2];
  undefined1 local_320 [32];
  undefined **local_300;
  undefined1 local_2f8;
  _Elt_pointer local_2f0;
  char local_2e8;
  _Elt_pointer local_2e0;
  __shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  RuntimeVariableAnalyser local_2c8;
  string local_290;
  undefined8 local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_268;
  Executor local_260;
  
  std::__cxx11::string::string((string *)&local_290,(string *)&node->name_);
  oVar6 = Context::lookup(&this->context_,&local_290,0);
  _Var3 = oVar6.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>._M_payload;
  if (node->operator_ == Assign) {
    std::__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2d8,
               &(node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>);
    local_260.super_Visitor._vptr_Visitor = (_func_int **)&PTR__ValueChanger_00149138;
    local_260.value_._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl =
         (__uniq_ptr_data<Value,_std::default_delete<Value>,_true,_true>)
         (__uniq_ptr_data<Value,_std::default_delete<Value>,_true,_true>)local_2d8._M_ptr;
    local_260.context_.scopes_.
    super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_2d8._M_refcount._M_pi;
    local_2d8._M_ptr = (element_type *)0x0;
    local_2d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
    if (((undefined1  [16])
         oVar6.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
         super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
    (**(code **)(*(long *)_Var3 + 0x10))(_Var3,&local_260);
    ValueChanger::~ValueChanger((ValueChanger *)&local_260);
  }
  else {
    RuntimeVariableAnalyser::RuntimeVariableAnalyser(&local_2c8);
    if (((undefined1  [16])
         oVar6.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
         super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
    (**(code **)(*(long *)_Var3 + 0x10))(_Var3,&local_2c8);
    Executor(&local_260,
             (Context *)
             local_2c8.context_.
             super__Optional_base<std::reference_wrapper<const_Context>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<const_Context>_>._M_payload);
    (*((local_2c8.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_Node)._vptr_Node[2])
              (local_2c8.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_260);
    value._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl =
         local_260.value_._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
         super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
         super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    __k = &node->operator_;
    local_300 = &PTR__ValueVisitor_00149c88;
    local_2f8 = 0;
    local_2e8 = '\0';
    local_338._M_head_impl._0_4_ = 0;
    pmVar4 = std::__detail::
             _Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&AssignmentOperationNames_abi_cxx11_,__k);
    pEVar5 = (Executor *)local_320;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar5,
                   "assignment operation ",pmVar4);
    assertValueType(pEVar5,(Value *)value._M_t.
                                    super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
                                    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                                    super__Head_base<0UL,_Value_*,_false>._M_head_impl,
                    (TypeName *)&local_338,(string *)local_320,(Node *)node);
    std::__cxx11::string::~string((string *)local_320);
    (**(code **)(*(long *)local_260.value_._M_t.
                          super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
                          super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
                          super__Head_base<0UL,_Value_*,_false>._M_head_impl + 0x18))
              (local_260.value_._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
               super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
               super__Head_base<0UL,_Value_*,_false>._M_head_impl,&local_300);
    if (local_2e8 == '\0') {
      std::__throw_bad_optional_access();
    }
    local_2e0 = local_2f0;
    peVar1 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_Node)._vptr_Node[2])(peVar1,this);
    pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    local_338._M_head_impl = (Value *)((ulong)local_338._M_head_impl._4_4_ << 0x20);
    pmVar4 = std::__detail::
             _Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&AssignmentOperationNames_abi_cxx11_,__k);
    pEVar5 = (Executor *)local_320;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar5,
                   "assignment operation ",pmVar4);
    assertValueType(pEVar5,pVVar2,(TypeName *)&local_338,(string *)local_320,(Node *)node);
    std::__cxx11::string::~string((string *)local_320);
    pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (*pVVar2->_vptr_Value[3])(pVVar2,&local_300);
    if (local_2e8 == '\0') {
      std::__throw_bad_optional_access();
    }
    switch(*__k) {
    case PlusEq:
      break;
    case MinusEq:
      break;
    case MulEq:
      break;
    case DivEq:
      break;
    case AndEq:
      break;
    case OrEq:
      break;
    case XorEq:
      break;
    case ShiftLeftEq:
      break;
    case ShiftRightEq:
    }
    std::make_shared<NumericLiteralNode,double&>((double *)&local_338);
    local_320._16_8_ = a_Stack_330[0]._M_pi;
    local_320._8_8_ = local_338._M_head_impl;
    local_320._0_8_ = &PTR__ValueChanger_00149138;
    local_338._M_head_impl = (Value *)0x0;
    a_Stack_330[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_270._0_1_ = (ostringstream)0x0;
    local_270._1_7_ = 0;
    _Stack_268._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_330);
    (**(code **)(*(long *)_Var3 + 0x10))(_Var3,local_320);
    ValueChanger::~ValueChanger((ValueChanger *)local_320);
    ~Executor(&local_260);
    RuntimeVariableAnalyser::~RuntimeVariableAnalyser(&local_2c8);
  }
  std::__cxx11::string::~string((string *)&local_290);
  return;
}

Assistant:

void Executor::visit(const AssignmentNode& node)
{
  const auto name = node.getName();
  auto symbol = context_.lookup(name);
  if(node.getOperation() == AssignmentOperator::Assign)
  {
    ValueChanger valueChanger{node.getValue()};
    symbol.value().get().accept(valueChanger);
  }
  else
  {
    RuntimeVariableAnalyser analyser{};
    symbol.value().get().accept(analyser);
    Executor executor{analyser.getContext()};
    analyser.getValue()->accept(executor);

    NumberValueAnalyser valueAnalyser{};

    assertValueType(*executor.getValue(), TypeName::F32,
                    "assignment operation " + AssignmentOperationNames.at(node.getOperation()), node);

    executor.getValue()->accept(valueAnalyser);
    const auto oldValue = valueAnalyser.getValue().value();

    node.getValue()->accept(*this);

    assertValueType(*value_, TypeName::F32,
      "assignment operation " + AssignmentOperationNames.at(node.getOperation()), node);

    value_->accept(valueAnalyser);
    const auto rhs = valueAnalyser.getValue().value();

    double newValue = oldValue;
    switch(node.getOperation())
    {
      case AssignmentOperator::PlusEq:
        newValue = oldValue + rhs;
        break;
      case AssignmentOperator::MinusEq:
        newValue = oldValue - rhs;
        break;
      case AssignmentOperator::MulEq:
        newValue = oldValue * rhs;
        break;
      case AssignmentOperator::DivEq:
        newValue = oldValue / rhs;
        break;
      case AssignmentOperator::OrEq:
        newValue = static_cast<unsigned int>(oldValue) | static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::AndEq:
        newValue = static_cast<unsigned int>(oldValue) & static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::XorEq:
        newValue = static_cast<unsigned int>(oldValue) ^ static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::ShiftLeftEq:
        newValue = static_cast<unsigned int>(oldValue) << static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::ShiftRightEq:
        newValue = static_cast<unsigned int>(oldValue) >> static_cast<unsigned int>(rhs);
        break;
      case AssignmentOperator::Assign:
        break; // Unreachable
    }

    ValueChanger valueChanger{std::make_shared<NumericLiteralNode>(newValue)};
    symbol.value().get().accept(valueChanger);
  }
}